

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_info.cpp
# Opt level: O2

string * duckdb::ParseInfo::QualifierToString
                   (string *__return_storage_ptr__,string *catalog,string *schema,string *name)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_58;
  string local_38;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (catalog->_M_string_length == 0) {
    if (schema->_M_string_length == 0) goto LAB_00645381;
    bVar1 = ::std::operator!=(schema,"main");
    if (!bVar1) goto LAB_00645381;
    KeywordHelper::WriteOptionallyQuoted(&local_38,schema,'\"',true);
    ::std::operator+(&bStack_58,&local_38,".");
    ::std::__cxx11::string::append((string *)__return_storage_ptr__);
  }
  else {
    KeywordHelper::WriteOptionallyQuoted(&local_38,catalog,'\"',true);
    ::std::operator+(&bStack_58,&local_38,".");
    ::std::__cxx11::string::append((string *)__return_storage_ptr__);
    ::std::__cxx11::string::~string((string *)&bStack_58);
    ::std::__cxx11::string::~string((string *)&local_38);
    if (schema->_M_string_length == 0) goto LAB_00645381;
    KeywordHelper::WriteOptionallyQuoted(&local_38,schema,'\"',true);
    ::std::operator+(&bStack_58,&local_38,".");
    ::std::__cxx11::string::append((string *)__return_storage_ptr__);
  }
  ::std::__cxx11::string::~string((string *)&bStack_58);
  ::std::__cxx11::string::~string((string *)&local_38);
LAB_00645381:
  KeywordHelper::WriteOptionallyQuoted(&bStack_58,name,'\"',true);
  ::std::__cxx11::string::append((string *)__return_storage_ptr__);
  ::std::__cxx11::string::~string((string *)&bStack_58);
  return __return_storage_ptr__;
}

Assistant:

string ParseInfo::QualifierToString(const string &catalog, const string &schema, const string &name) {
	string result;
	if (!catalog.empty()) {
		result += KeywordHelper::WriteOptionallyQuoted(catalog) + ".";
		if (!schema.empty()) {
			result += KeywordHelper::WriteOptionallyQuoted(schema) + ".";
		}
	} else if (!schema.empty() && schema != DEFAULT_SCHEMA) {
		result += KeywordHelper::WriteOptionallyQuoted(schema) + ".";
	}
	result += KeywordHelper::WriteOptionallyQuoted(name);
	return result;
}